

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void gai_iterator_init(Integer g_a,Integer *lo,Integer *hi,_iterator_hdl *hdl)

{
  Integer *np;
  global_array_t *pgVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  global_array_t *pgVar5;
  int iVar6;
  Integer _ndim;
  Integer IVar7;
  Integer *map;
  Integer *proclist;
  int *piVar8;
  ulong uVar9;
  logical lVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *__s;
  char err_string [256];
  
  lVar14 = g_a + 1000;
  uVar3._0_2_ = GA[lVar14].ndim;
  uVar3._2_2_ = GA[lVar14].irreg;
  IVar7 = pnga_pgroup_nnodes((long)GA[lVar14].p_handle);
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  map = (Integer *)malloc(IVar7 * 0xe00000000 >> 0x1d | 8);
  hdl->map = map;
  proclist = (Integer *)malloc((IVar7 << 0x20) >> 0x1d);
  hdl->proclist = proclist;
  piVar8 = (int *)malloc((IVar7 << 0x20) >> 0x1e);
  hdl->proclistperm = piVar8;
  uVar9 = 0;
  uVar15 = (ulong)uVar3;
  if ((short)(undefined2)uVar3 < 1) {
    uVar15 = uVar9;
  }
  uVar15 = uVar15 & 0xffff;
  for (; pgVar5 = GA, uVar15 != uVar9; uVar9 = uVar9 + 1) {
    hdl->lo[uVar9] = lo[uVar9];
    hdl->hi[uVar9] = hi[uVar9];
  }
  if ((uint)GA[lVar14].distr_type < 5) {
    pgVar1 = GA + lVar14;
    switch(GA[lVar14].distr_type) {
    case 0:
      np = &hdl->nproc;
      lVar10 = pnga_locate_region(g_a,lo,hi,map,proclist,np);
      if (lVar10 == 0) {
        builtin_strncpy(err_string,"cannot locate region: ",0x17);
        strcpy(err_string + 0x16,GA[lVar14].name);
        sVar11 = strlen(err_string);
        sprintf(err_string + (int)sVar11," [%ld:%ld ",*lo,*hi);
        sVar11 = strlen(err_string);
        lVar14 = 1;
        while( true ) {
          IVar7 = pnga_ndim(g_a);
          __s = err_string + (int)sVar11;
          if (IVar7 <= lVar14) break;
          sprintf(__s,",%ld:%ld ",lo[lVar14],hi[lVar14]);
          sVar11 = strlen(err_string);
          lVar14 = lVar14 + 1;
        }
        __s[0] = ']';
        __s[1] = '\0';
        pnga_error(err_string,g_a);
      }
      lVar14 = *np;
      if (lVar14 == 1) {
        *hdl->proclistperm = 0;
      }
      else {
        if (GAnproc < lVar14) {
          pnga_error("permute_proc: error ",lVar14);
        }
        srand((uint)GAme);
        lVar14 = *np;
        lVar13 = 0;
        lVar12 = 0;
        if (0 < lVar14) {
          lVar12 = lVar14;
        }
        for (; lVar12 != lVar13; lVar13 = lVar13 + 1) {
          hdl->proclistperm[lVar13] = (int)lVar13;
        }
        for (lVar12 = 0; lVar12 < lVar14; lVar12 = lVar12 + 1) {
          iVar6 = rand();
          piVar8 = hdl->proclistperm;
          lVar14 = hdl->nproc;
          iVar4 = piVar8[(long)iVar6 % lVar14];
          piVar8[(long)iVar6 % lVar14] = piVar8[lVar12];
          piVar8[lVar12] = iVar4;
        }
      }
      break;
    case 1:
      hdl->iproc = 0;
      IVar7 = pnga_nodeid();
      hdl->iblock = IVar7;
      break;
    case 2:
      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
        lVar14 = pgVar5[g_a + 1000].block_dims[uVar9];
        hdl->blk_size[uVar9] = lVar14;
        lVar14 = pgVar5[g_a + 1000].nblock[uVar9] * lVar14;
        hdl->blk_dim[uVar9] = lVar14;
        lVar12 = pgVar5[g_a + 1000].dims[uVar9] / lVar14;
        hdl->blk_num[uVar9] = lVar12;
        lVar14 = pgVar5[g_a + 1000].dims[uVar9] - lVar14 * lVar12;
        hdl->blk_inc[uVar9] = lVar14;
        hdl->blk_ld[uVar9] = lVar12 * pgVar5[g_a + 1000].block_dims[uVar9];
        hdl->hlf_blk[uVar9] = lVar14 / pgVar5[g_a + 1000].block_dims[uVar9];
      }
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar2 = pgVar1->ndim;
      hdl->proc_index[0] = 0;
      for (lVar14 = 0x53; lVar14 + -0x52 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
      hdl->index[0] = 0;
      for (lVar14 = 0x5a; lVar14 + -0x59 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
      break;
    case 3:
      hdl->offset = 0;
      hdl->iproc = 0;
      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
        hdl->blk_size[uVar9] = pgVar5[lVar14].block_dims[uVar9];
      }
      sVar2 = pgVar1->ndim;
      hdl->proc_index[0] = 0;
      for (lVar14 = 0x53; lVar14 + -0x52 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
      hdl->index[0] = 0;
      for (lVar14 = 0x5a; lVar14 + -0x59 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
      break;
    case 4:
      hdl->offset = 0;
      hdl->iproc = 0;
      hdl->mapc = pgVar5[lVar14].mapc;
      sVar2 = pgVar1->ndim;
      hdl->proc_index[0] = 0;
      for (lVar14 = 0x53; lVar14 + -0x52 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
      hdl->index[0] = 0;
      for (lVar14 = 0x5a; lVar14 + -0x59 < (long)sVar2; lVar14 = lVar14 + 1) {
        hdl->lo[lVar14 + -1] = 0;
      }
    }
  }
  return;
}

Assistant:

void gai_iterator_init(Integer g_a, Integer lo[], Integer hi[],
                       _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  Integer i;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  hdl->map = malloc((size_t)(nproc*2*MAXDIM+1)*sizeof(Integer));
  hdl->proclist = malloc(nproc*sizeof(Integer));;
  hdl->proclistperm = malloc(nproc*sizeof(int));
  for (i=0; i<ndim; i++) {
    hdl->lo[i] = lo[i];
    hdl->hi[i] = hi[i];
  }
  /* Standard GA distribution */
  if (GA[handle].distr_type == REGULAR) {
    /* Locate the processors containing some portion of the patch
     * specified by lo and hi and return the results in hdl->map,
     * hdl->proclist, and np. hdl->proclist contains a list of processors
     * containing some portion of the patch, hdl->map contains
     * the lower and upper indices of the portion of the patch held
     * by a given processor, and np contains the total number of
     * processors that contain some portion of the patch.
     */
    if(!pnga_locate_region(g_a, lo, hi, hdl->map, hdl->proclist, &hdl->nproc ))
      ga_RegionError(pnga_ndim(g_a), lo, hi, g_a);

    gaPermuteProcList(hdl->nproc, hdl->proclistperm);

    /* Block-cyclic distribution */
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = pnga_nodeid();
  } else if (GA[handle].distr_type == SCALAPACK)  {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    C_Integer *block_dims;
    /* Scalapack-type block-cyclic data distribution */
    /* Calculate some properties associated with data distribution */
    int *proc_grid = GA[handle].nblock;
    /*num_blocks = GA[handle].num_blocks;*/
    block_dims = GA[handle].block_dims;
    /* blk_dim: length of one repeat unit
     * blk_num: number of repeat units
     * blk_inc: number of elements in last incomplete repeat unit
     * blk_ld: length of complete blocks in repeat unit. Does not
     *         account for partial block at end
     * hlf_blk: number of full blocks in partial repeat unit
     */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
      hdl->blk_dim[j] = block_dims[j]*proc_grid[j];
      hdl->blk_num[j] = GA[handle].dims[j]/hdl->blk_dim[j];
      hdl->blk_inc[j] = GA[handle].dims[j]-hdl->blk_num[j]*hdl->blk_dim[j];
      hdl->blk_ld[j] = hdl->blk_num[j]*block_dims[j];
      hdl->hlf_blk[j] = hdl->blk_inc[j]/block_dims[j];
    }
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED)  {
    int j;
    C_Integer *block_dims;
    hdl->iproc = 0;
    hdl->offset = 0;
    block_dims = GA[handle].block_dims;
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG)  {
    int j;
    hdl->iproc = 0;
    hdl->offset = 0;
    hdl->mapc =  GA[handle].mapc;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}